

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::ShiftMixParseVarint32Test_HittingLimit_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::ShiftMixParseVarint32Test_HittingLimit_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_019226d8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__ShiftMixParseVarint32Test_HittingLimit_Test_01922718;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }